

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# power.c
# Opt level: O0

int envy_bios_parse_power_unk60(envy_bios *bios)

{
  uint8_t uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  envy_bios_power_unk60 *peVar5;
  envy_bios_power_unk60_entry *peVar6;
  uint32_t data;
  int err;
  int i;
  envy_bios_power_unk60 *unk60;
  envy_bios *bios_local;
  
  peVar5 = &(bios->power).unk60;
  if (peVar5->offset == 0) {
    bios_local._4_4_ = -0x16;
  }
  else {
    bios_u8(bios,peVar5->offset,&(bios->power).unk60.version);
    uVar1 = (bios->power).unk60.version;
    if ((uVar1 == '\x10') || (uVar1 == ' ')) {
      iVar2 = bios_u8(bios,peVar5->offset + 1,&(bios->power).unk60.hlen);
      iVar3 = bios_u8(bios,peVar5->offset + 2,&(bios->power).unk60.rlen);
      iVar4 = bios_u8(bios,peVar5->offset + 3,&(bios->power).unk60.entriesnum);
      (bios->power).unk60.valid = ((iVar4 != 0 || (iVar3 != 0 || iVar2 != 0)) ^ 0xffU) & 1;
      peVar6 = (envy_bios_power_unk60_entry *)malloc((ulong)(bios->power).unk60.entriesnum << 2);
      (bios->power).unk60.entries = peVar6;
      for (data = 0; (int)data < (int)(uint)(bios->power).unk60.entriesnum; data = data + 1) {
        (bios->power).unk60.entries[(int)data].offset =
             peVar5->offset + (uint)(bios->power).unk60.hlen + data * (bios->power).unk60.rlen;
      }
      bios_local._4_4_ = 0;
    }
    else {
      fprintf(_stderr,"Unknown DI/DT table version 0x%x\n",(ulong)(bios->power).unk60.version);
      bios_local._4_4_ = -0x16;
    }
  }
  return bios_local._4_4_;
}

Assistant:

int envy_bios_parse_power_unk60(struct envy_bios *bios) {
	struct envy_bios_power_unk60 *unk60 = &bios->power.unk60;
	int i, err = 0;

	if (!unk60->offset)
		return -EINVAL;

	bios_u8(bios, unk60->offset + 0x0, &unk60->version);
	switch(unk60->version) {
	case 0x10:
	case 0x20:
		err |= bios_u8(bios, unk60->offset + 0x1, &unk60->hlen);
		err |= bios_u8(bios, unk60->offset + 0x2, &unk60->rlen);
		err |= bios_u8(bios, unk60->offset + 0x3, &unk60->entriesnum);
		unk60->valid = !err;
		break;
	default:
		ENVY_BIOS_ERR("Unknown DI/DT table version 0x%x\n", unk60->version);
		return -EINVAL;
	};

	err = 0;
	unk60->entries = malloc(unk60->entriesnum * sizeof(struct envy_bios_power_unk60_entry));
	for (i = 0; i < unk60->entriesnum; i++) {
		uint32_t data = unk60->offset + unk60->hlen + i * unk60->rlen;

		unk60->entries[i].offset = data;
	}

	return 0;
}